

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvc.c
# Opt level: O0

err_t cvcMatch(int argc,char **argv)

{
  octet *cert_00;
  octet *privkey_00;
  octet *in_RSI;
  int in_EDI;
  octet *cert;
  size_t cert_len;
  octet *privkey;
  size_t privkey_len;
  size_t *in_stack_00000030;
  int readc;
  cmd_pwd_t pwd;
  err_t code;
  int iVar1;
  undefined4 in_stack_ffffffffffffffac;
  u32 in_stack_ffffffffffffffb0;
  char **in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  bool_t *in_stack_ffffffffffffffc8;
  btok_cvc_t *in_stack_ffffffffffffffd0;
  int local_24;
  int in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe8;
  err_t local_4;
  
  local_4 = cmdStDo(in_stack_ffffffffffffffb0);
  if ((local_4 == 0) &&
     (iVar1 = in_EDI,
     local_4 = cvcParseOptions(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                               (bool_t *)
                               CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                               in_stack_ffffffffffffffb8,in_RSI,
                               (int *)CONCAT44(in_stack_ffffffffffffffac,in_EDI),
                               in_stack_ffffffffffffffe0,(char **)(ulong)in_stack_ffffffffffffffe8),
     local_4 == 0)) {
    if (in_EDI - local_24 != 2) {
      local_4 = 0x25b;
    }
    if (local_4 == 0) {
      local_4 = cmdFileValExist(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      if (local_4 == 0) {
        local_4 = cmdPrivkeyRead((octet *)pwd,in_stack_00000030,(char *)privkey_len,
                                 (cmd_pwd_t)privkey);
        if (local_4 == 0) {
          cert_00 = (octet *)blobCreate(CONCAT44(in_stack_ffffffffffffffac,iVar1));
          local_4 = 0x6e;
          if (cert_00 != (octet *)0x0) {
            local_4 = 0;
          }
          if (local_4 == 0) {
            local_4 = cmdPrivkeyRead((octet *)pwd,in_stack_00000030,(char *)privkey_len,
                                     (cmd_pwd_t)privkey);
            cmdPwdClose((cmd_pwd_t)0x10f6e2);
            if (local_4 == 0) {
              local_4 = cmdFileReadAll(cert_00,(size_t *)
                                               CONCAT44(in_stack_ffffffffffffffc4,
                                                        in_stack_ffffffffffffffc0),
                                       (char *)in_stack_ffffffffffffffb8);
              if (local_4 == 0) {
                privkey_00 = (octet *)blobCreate(CONCAT44(in_stack_ffffffffffffffac,iVar1));
                local_4 = 0x6e;
                if (privkey_00 != (octet *)0x0) {
                  local_4 = 0;
                }
                if (local_4 == 0) {
                  local_4 = cmdFileReadAll(cert_00,(size_t *)
                                                   CONCAT44(in_stack_ffffffffffffffc4,
                                                            in_stack_ffffffffffffffc0),
                                           (char *)privkey_00);
                  if (local_4 == 0) {
                    local_4 = btokCVCMatch(cert_00,CONCAT44(in_stack_ffffffffffffffc4,
                                                            in_stack_ffffffffffffffc0),privkey_00,
                                           (size_t)in_RSI);
                    blobClose((blob_t)0x10f7e0);
                    blobClose((blob_t)0x10f7ea);
                  }
                  else {
                    blobClose((blob_t)0x10f7a5);
                    blobClose((blob_t)0x10f7af);
                  }
                }
                else {
                  blobClose((blob_t)0x10f76e);
                }
              }
              else {
                blobClose((blob_t)0x10f72c);
              }
            }
            else {
              blobClose((blob_t)0x10f6f3);
            }
          }
          else {
            cmdPwdClose((cmd_pwd_t)0x10f6ac);
          }
        }
        else {
          cmdPwdClose((cmd_pwd_t)0x10f66a);
        }
      }
    }
    else {
      cmdPwdClose((cmd_pwd_t)0x10f5fd);
    }
  }
  return local_4;
}

Assistant:

static err_t cvcMatch(int argc, char* argv[])
{
	err_t code;
	cmd_pwd_t pwd;
	int readc;
	size_t privkey_len;
	octet* privkey;
	size_t cert_len;
	octet* cert;
	// самотестирование
	code = cmdStDo(CMD_ST_BIGN);
	ERR_CALL_CHECK(code);
	// обработать опции
	code = cvcParseOptions(0, 0, 0, &pwd, 0, &readc, argc, argv);
	ERR_CALL_CHECK(code);
	argc -= readc, argv += readc;
	if (argc != 2)
		code = ERR_CMD_PARAMS;
	ERR_CALL_HANDLE(code, cmdPwdClose(pwd));
	// проверить наличие/отсутствие файлов
	code = cmdFileValExist(2, argv);
	ERR_CALL_CHECK(code);
	// прочитать личный ключ
	privkey_len = 0;
	code = cmdPrivkeyRead(0, &privkey_len, argv[0], pwd);
	ERR_CALL_HANDLE(code, cmdPwdClose(pwd));
	code = cmdBlobCreate(privkey, privkey_len);
	ERR_CALL_HANDLE(code, cmdPwdClose(pwd));
	code = cmdPrivkeyRead(privkey, 0, argv[0], pwd);
	cmdPwdClose(pwd);
	ERR_CALL_HANDLE(code, cmdBlobClose(privkey));
	// определить длину сертификата
	code = cmdFileReadAll(0, &cert_len, argv[1]);
	ERR_CALL_HANDLE(code, cmdBlobClose(privkey));
	// прочитать сертификат
	code = cmdBlobCreate(cert, cert_len);
	ERR_CALL_HANDLE(code, cmdBlobClose(privkey));
	code = cmdFileReadAll(cert, &cert_len, argv[1]);
	ERR_CALL_HANDLE(code, (cmdBlobClose(privkey), cmdBlobClose(cert)));
	// проверить соответствие
	code = btokCVCMatch(cert, cert_len, privkey, privkey_len);
	// завершить
	cmdBlobClose(cert);
	cmdBlobClose(privkey);
	return code;
}